

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

char * soplex::LPFgetRowName<double>
                 (SPxLPBase<double> *p_lp,int p_idx,NameSet *p_rnames,char *p_buf,
                 int p_num_written_rows)

{
  Item *pIVar1;
  SPxRowId SVar2;
  
  if (p_rnames != (NameSet *)0x0) {
    SVar2 = SPxLPBase<double>::rId(p_lp,p_idx);
    pIVar1 = (p_rnames->set).theitem;
    if (-1 < pIVar1[(long)SVar2.super_DataKey >> 0x20].info) {
      return p_rnames->mem + pIVar1[(long)SVar2.super_DataKey >> 0x20].data;
    }
  }
  spxSnprintf(p_buf,0x10,"C%d",(ulong)(uint)p_num_written_rows);
  return p_buf;
}

Assistant:

static const char* LPFgetRowName(
   const SPxLPBase<R>& p_lp,
   int                    p_idx,
   const NameSet*         p_rnames,
   char*                  p_buf,
   int                    p_num_written_rows
)
{
   assert(p_buf != nullptr);
   assert(p_idx >= 0);
   assert(p_idx <  p_lp.nRows());

   if(p_rnames != nullptr)
   {
      DataKey key = p_lp.rId(p_idx);

      if(p_rnames->has(key))
         return (*p_rnames)[key];
   }

   spxSnprintf(p_buf, 16, "C%d", p_num_written_rows);

   return p_buf;
}